

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_remove_primary_compressor(AV1_PRIMARY *ppi)

{
  long in_RDI;
  int frame;
  TplParams *tpl_data;
  int i;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  if (in_RDI != 0) {
    av1_tf_info_free((TEMPORAL_FILTER_INFO *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    for (iVar2 = 0; iVar2 < 0x20; iVar2 = iVar2 + 1) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    av1_lookahead_destroy
              ((lookahead_ctx *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    *(undefined8 *)(in_RDI + 0xd2a0) = 0;
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    for (iVar1 = 0; iVar1 < 0x30; iVar1 = iVar1 + 1) {
      aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      aom_free_frame_buffer(in_stack_ffffffffffffffd8);
      *(undefined8 *)(in_RDI + 0xfa10 + (long)iVar1 * 8) = 0;
    }
    av1_tpl_dealloc((AV1TplRowMultiThreadSync *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    av1_terminate_workers((AV1_PRIMARY *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    free_thread_data(ppi);
    aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    *(undefined8 *)(in_RDI + 0x12410) = 0;
    aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    *(undefined8 *)(in_RDI + 0x12408) = 0;
    *(undefined4 *)(in_RDI + 0x123d0) = 0;
    aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

void av1_remove_primary_compressor(AV1_PRIMARY *ppi) {
  if (!ppi) return;
#if !CONFIG_REALTIME_ONLY
  av1_tf_info_free(&ppi->tf_info);
#endif  // !CONFIG_REALTIME_ONLY

  for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i) {
    aom_free(ppi->level_params.level_info[i]);
  }
  av1_lookahead_destroy(ppi->lookahead);

  aom_free(ppi->tpl_sb_rdmult_scaling_factors);
  ppi->tpl_sb_rdmult_scaling_factors = NULL;

  TplParams *const tpl_data = &ppi->tpl_data;
  aom_free(tpl_data->txfm_stats_list);

  for (int frame = 0; frame < MAX_LAG_BUFFERS; ++frame) {
    aom_free(tpl_data->tpl_stats_pool[frame]);
    aom_free_frame_buffer(&tpl_data->tpl_rec_pool[frame]);
    tpl_data->tpl_stats_pool[frame] = NULL;
  }

#if !CONFIG_REALTIME_ONLY
  av1_tpl_dealloc(&tpl_data->tpl_mt_sync);
#endif

  av1_terminate_workers(ppi);
  free_thread_data(ppi);

  aom_free(ppi->p_mt_info.tile_thr_data);
  ppi->p_mt_info.tile_thr_data = NULL;
  aom_free(ppi->p_mt_info.workers);
  ppi->p_mt_info.workers = NULL;
  ppi->p_mt_info.num_workers = 0;

  aom_free(ppi);
}